

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

mbedtls_asn1_named_data *
mbedtls_asn1_store_named_data
          (mbedtls_asn1_named_data **head,char *oid,size_t oid_len,uchar *val,size_t val_len)

{
  mbedtls_asn1_named_data *pmVar1;
  int iVar2;
  mbedtls_asn1_named_data *__ptr;
  uchar *puVar3;
  uchar *puVar4;
  
  pmVar1 = *head;
  for (__ptr = pmVar1; __ptr != (mbedtls_asn1_named_data *)0x0; __ptr = __ptr->next) {
    if (((__ptr->oid).len == oid_len) && (iVar2 = bcmp((__ptr->oid).p,oid,oid_len), iVar2 == 0)) {
      if (val_len == 0) {
        free((__ptr->val).p);
        (__ptr->val).p = (uchar *)0x0;
      }
      else if ((__ptr->val).len != val_len) {
        puVar3 = (uchar *)calloc(1,val_len);
        if (puVar3 == (uchar *)0x0) {
          return (mbedtls_asn1_named_data *)0x0;
        }
        free((__ptr->val).p);
        (__ptr->val).p = puVar3;
        (__ptr->val).len = val_len;
      }
      goto LAB_0012611f;
    }
  }
  __ptr = (mbedtls_asn1_named_data *)calloc(1,0x40);
  if (__ptr != (mbedtls_asn1_named_data *)0x0) {
    (__ptr->oid).len = oid_len;
    puVar3 = (uchar *)calloc(1,oid_len);
    (__ptr->oid).p = puVar3;
    if (puVar3 != (uchar *)0x0) {
      memcpy(puVar3,oid,oid_len);
      (__ptr->val).len = val_len;
      if (val_len == 0) {
LAB_001260c1:
        __ptr->next = pmVar1;
        *head = __ptr;
LAB_0012611f:
        if (val != (uchar *)0x0) {
          memcpy((__ptr->val).p,val,val_len);
          return __ptr;
        }
        return __ptr;
      }
      puVar4 = (uchar *)calloc(1,val_len);
      (__ptr->val).p = puVar4;
      if (puVar4 != (uchar *)0x0) goto LAB_001260c1;
      free(puVar3);
    }
    free(__ptr);
  }
  return (mbedtls_asn1_named_data *)0x0;
}

Assistant:

mbedtls_asn1_named_data *mbedtls_asn1_store_named_data(
                                        mbedtls_asn1_named_data **head,
                                        const char *oid, size_t oid_len,
                                        const unsigned char *val,
                                        size_t val_len )
{
    mbedtls_asn1_named_data *cur;

    if( ( cur = asn1_find_named_data( *head, oid, oid_len ) ) == NULL )
    {
        // Add new entry if not present yet based on OID
        //
        cur = (mbedtls_asn1_named_data*)mbedtls_calloc( 1,
                                            sizeof(mbedtls_asn1_named_data) );
        if( cur == NULL )
            return( NULL );

        cur->oid.len = oid_len;
        cur->oid.p = mbedtls_calloc( 1, oid_len );
        if( cur->oid.p == NULL )
        {
            mbedtls_free( cur );
            return( NULL );
        }

        memcpy( cur->oid.p, oid, oid_len );

        cur->val.len = val_len;
        if( val_len != 0 )
        {
            cur->val.p = mbedtls_calloc( 1, val_len );
            if( cur->val.p == NULL )
            {
                mbedtls_free( cur->oid.p );
                mbedtls_free( cur );
                return( NULL );
            }
        }

        cur->next = *head;
        *head = cur;
    }
    else if( val_len == 0 )
    {
        mbedtls_free( cur->val.p );
        cur->val.p = NULL;
    }
    else if( cur->val.len != val_len )
    {
        /*
         * Enlarge existing value buffer if needed
         * Preserve old data until the allocation succeeded, to leave list in
         * a consistent state in case allocation fails.
         */
        void *p = mbedtls_calloc( 1, val_len );
        if( p == NULL )
            return( NULL );

        mbedtls_free( cur->val.p );
        cur->val.p = p;
        cur->val.len = val_len;
    }

    if( val != NULL )
        memcpy( cur->val.p, val, val_len );

    return( cur );
}